

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  FileDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  FileOptions *this_00;
  pointer pCVar7;
  reference pvVar8;
  pointer pEVar9;
  reference pvVar10;
  pointer pMVar11;
  EnumDescriptor *pEVar12;
  pointer pGVar13;
  pointer pEVar14;
  Descriptor *descriptor;
  ServiceDescriptor *pSVar15;
  pointer pSVar16;
  Printer *b;
  char *pcVar17;
  string_view java_class_name;
  string_view local_2b0;
  string_view local_2a0;
  string_view local_290;
  int local_27c;
  int local_278;
  int i_7;
  int method_num;
  int bytecode_estimate;
  string_view local_260;
  int local_24c;
  undefined4 local_248;
  int i_6;
  int static_block_bytecode_estimate;
  int i_5;
  unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
  generator;
  int i_4;
  int i_3;
  int local_224;
  undefined1 auStack_220 [4];
  int i_2;
  string_view local_210;
  int local_200;
  int local_1fc;
  int i_1;
  int i;
  string_view local_1e8;
  undefined1 local_1d8 [16];
  string_view local_1c8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1b0;
  string_view local_1a8;
  string_view local_198;
  char *local_188;
  string_view local_180;
  string_view local_170;
  Options local_160;
  byte local_fa;
  allocator<char> local_f9;
  AlphaNum local_f8;
  AlphaNum local_c8;
  string local_98;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// NO CHECKED-IN PROTOBUF GENCODE\n// source: $filename$\n"
            );
  local_38 = FileDescriptor::name(this->file_);
  io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
            (printer,local_28,(char (*) [9])"filename",&local_38);
  pPVar2 = local_18;
  if (((this->options_).opensource_runtime & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"// Protobuf Java Version: $protobuf_java_version$\n");
    io::Printer::Print<char[22],char[11]>
              (pPVar2,local_48,(char (*) [22])"protobuf_java_version",(char (*) [11])"4.31.0-dev");
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"\n");
  io::Printer::Print<>(pPVar2,local_58);
  uVar6 = std::__cxx11::string::empty();
  pPVar2 = local_18;
  if ((uVar6 & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,"package $package$;\n\n");
    io::Printer::Print<char[8],std::__cxx11::string>
              (pPVar2,local_68,(char (*) [8])0xb93e53,&this->java_package_);
  }
  pPVar2 = local_18;
  local_fa = 0;
  if (((this->options_).annotate_code & 1U) == 0) {
    std::allocator<char>::allocator();
    local_fa = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_f9);
  }
  else {
    b = local_18;
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_c8,&this->classname_);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f8,".java.pb.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_98,(lts_20250127 *)&local_c8,&local_f8,(AlphaNum *)b);
  }
  local_78 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
  java::Options::Options(&local_160,&this->options_);
  PrintGeneratedAnnotation(pPVar2,'$',local_78,&local_160);
  java::Options::~Options(&local_160);
  std::__cxx11::string::~string((string *)&local_98);
  if ((local_fa & 1) != 0) {
    std::allocator<char>::~allocator(&local_f9);
  }
  pPVar2 = local_18;
  if (((this->options_).opensource_runtime & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_170,"@com.google.protobuf.Internal.ProtoNonnullApi\n");
    io::Printer::Print<>(pPVar2,local_170);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_180,"$deprecation$public final class $classname$ {\n  private $ctor$() {}\n");
  this_00 = FileDescriptor::options(this->file_);
  bVar3 = FileOptions::deprecated(this_00);
  local_188 = "";
  if (bVar3) {
    local_188 = "@java.lang.Deprecated ";
  }
  io::Printer::
  Print<char[12],char_const*,char[10],std::__cxx11::string,char[5],std::__cxx11::string>
            (pPVar2,local_180,(char (*) [12])0xb17573,&local_188,(char (*) [10])0xa117a7,
             &this->classname_,(char (*) [5])0xa05118,&this->classname_);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"classname");
  local_1a8 = FileDescriptor::name(this->file_);
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1b0);
  pcVar17 = local_1a8._M_str;
  io::Printer::Annotate(pPVar2,local_198,local_1a8,local_1b0);
  io::Printer::Indent(local_18);
  pCVar7 = std::
           unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
           ::operator->(&this->context_);
  bVar3 = Context::EnforceLite(pCVar7);
  pPVar2 = local_18;
  if (!bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1c8,"static {\n");
    io::Printer::Print<>(pPVar2,local_1c8);
    io::Printer::Indent(local_18);
    pPVar2 = local_18;
    bVar3 = (this->options_).opensource_runtime;
    local_1d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&this->classname_);
    java_class_name._M_str = pcVar17;
    java_class_name._M_len = local_1d8._8_8_;
    PrintGencodeVersionValidator
              ((java *)pPVar2,(Printer *)(ulong)(bVar3 & 1),local_1d8[0],java_class_name);
    io::Printer::Outdent(local_18);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"}\n");
    io::Printer::Print<>(pPVar2,local_1e8);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&i_1,
             "public static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistryLite registry) {\n"
            );
  io::Printer::Print<>(pPVar2,_i_1);
  io::Printer::Indent(local_18);
  local_1fc = 0;
  while( true ) {
    iVar5 = local_1fc;
    iVar4 = FileDescriptor::extension_count(this->file_);
    if (iVar4 <= iVar5) break;
    pvVar8 = std::
             vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
             ::operator[](&this->extension_generators_,(long)local_1fc);
    pEVar9 = std::
             unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
             ::operator->(pvVar8);
    (*pEVar9->_vptr_ExtensionGenerator[4])(pEVar9,local_18);
    local_1fc = local_1fc + 1;
  }
  local_200 = 0;
  while( true ) {
    iVar5 = local_200;
    iVar4 = FileDescriptor::message_type_count(this->file_);
    if (iVar4 <= iVar5) break;
    pvVar10 = std::
              vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
              ::operator[](&this->message_generators_,(long)local_200);
    pMVar11 = std::
              unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
              ::operator->(pvVar10);
    (*pMVar11->_vptr_MessageGenerator[6])(pMVar11,local_18);
    local_200 = local_200 + 1;
  }
  io::Printer::Outdent(local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_210,"}\n");
  io::Printer::Print<>(pPVar2,local_210);
  pFVar1 = this->file_;
  pCVar7 = std::
           unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
           ::operator->(&this->context_);
  bVar3 = Context::EnforceLite(pCVar7);
  bVar3 = HasDescriptorMethods(pFVar1,bVar3);
  pPVar2 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_220,
               "\npublic static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistry registry) {\n  registerAllExtensions(\n      (com.google.protobuf.ExtensionRegistryLite) registry);\n}\n"
              );
    io::Printer::Print<>(pPVar2,_auStack_220);
  }
  local_224 = 0;
  while( true ) {
    iVar5 = local_224;
    iVar4 = FileDescriptor::enum_type_count(this->file_);
    if (iVar4 <= iVar5) break;
    pEVar12 = FileDescriptor::enum_type(this->file_,local_224);
    bVar3 = NestedInFileClass(pEVar12,(bool)(this->immutable_api_ & 1));
    if (bVar3) {
      pGVar13 = std::
                unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                ::operator->(&this->generator_factory_);
      pEVar12 = FileDescriptor::enum_type(this->file_,local_224);
      (*pGVar13->_vptr_GeneratorFactory[3])
                ((unique_ptr<google::protobuf::compiler::java::EnumGenerator,_std::default_delete<google::protobuf::compiler::java::EnumGenerator>_>
                  *)&i_4,pGVar13,pEVar12);
      pEVar14 = std::
                unique_ptr<google::protobuf::compiler::java::EnumGenerator,_std::default_delete<google::protobuf::compiler::java::EnumGenerator>_>
                ::operator->((unique_ptr<google::protobuf::compiler::java::EnumGenerator,_std::default_delete<google::protobuf::compiler::java::EnumGenerator>_>
                              *)&i_4);
      (*pEVar14->_vptr_EnumGenerator[2])(pEVar14,local_18);
      std::
      unique_ptr<google::protobuf::compiler::java::EnumGenerator,_std::default_delete<google::protobuf::compiler::java::EnumGenerator>_>
      ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::EnumGenerator,_std::default_delete<google::protobuf::compiler::java::EnumGenerator>_>
                     *)&i_4);
    }
    local_224 = local_224 + 1;
  }
  generator._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>._M_head_impl.
  _4_4_ = 0;
  while( true ) {
    iVar5 = generator._M_t.
            super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
            .super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>.
            _M_head_impl._4_4_;
    iVar4 = FileDescriptor::message_type_count(this->file_);
    if (iVar4 <= iVar5) break;
    descriptor = FileDescriptor::message_type
                           (this->file_,
                            generator._M_t.
                            super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>
                            ._M_head_impl._4_4_);
    bVar3 = NestedInFileClass(descriptor,(bool)(this->immutable_api_ & 1));
    if (bVar3) {
      pvVar10 = std::
                vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                ::operator[](&this->message_generators_,
                             (long)generator._M_t.
                                   super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                   .
                                   super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>
                                   ._M_head_impl._4_4_);
      pMVar11 = std::
                unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                ::operator->(pvVar10);
      (*pMVar11->_vptr_MessageGenerator[5])(pMVar11,local_18);
      pvVar10 = std::
                vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                ::operator[](&this->message_generators_,
                             (long)generator._M_t.
                                   super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                   .
                                   super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>
                                   ._M_head_impl._4_4_);
      pMVar11 = std::
                unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                ::operator->(pvVar10);
      (*pMVar11->_vptr_MessageGenerator[4])(pMVar11,local_18);
    }
    generator._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>._M_head_impl
    ._4_4_ = generator._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
             .super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>.
             _M_head_impl._4_4_ + 1;
  }
  pFVar1 = this->file_;
  pCVar7 = std::
           unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
           ::operator->(&this->context_);
  bVar3 = Context::EnforceLite(pCVar7);
  bVar3 = HasGenericServices(pFVar1,bVar3);
  if (bVar3) {
    generator._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>._M_head_impl
    ._0_4_ = 0;
    while( true ) {
      iVar5 = (int)generator._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>
                   ._M_head_impl;
      iVar4 = FileDescriptor::service_count(this->file_);
      if (iVar4 <= iVar5) break;
      pSVar15 = FileDescriptor::service
                          (this->file_,
                           (int)generator._M_t.
                                super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>
                                ._M_head_impl);
      bVar3 = NestedInFileClass(pSVar15,(bool)(this->immutable_api_ & 1));
      if (bVar3) {
        pGVar13 = std::
                  unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                  ::operator->(&this->generator_factory_);
        pSVar15 = FileDescriptor::service
                            (this->file_,
                             (int)generator._M_t.
                                  super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                  .
                                  super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>
                                  ._M_head_impl);
        (*pGVar13->_vptr_GeneratorFactory[5])
                  ((unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                    *)&static_block_bytecode_estimate,pGVar13,pSVar15);
        pSVar16 = std::
                  unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                  ::operator->((unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                *)&static_block_bytecode_estimate);
        (*pSVar16->_vptr_ServiceGenerator[2])(pSVar16,local_18);
        std::
        unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
        ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                       *)&static_block_bytecode_estimate);
      }
      generator._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>.
      _M_head_impl._0_4_ =
           (int)generator._M_t.
                super___uniq_ptr_impl<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                .super__Head_base<0UL,_google::protobuf::compiler::java::ServiceGenerator_*,_false>.
                _M_head_impl + 1;
    }
  }
  i_6 = 0;
  while( true ) {
    iVar5 = i_6;
    iVar4 = FileDescriptor::extension_count(this->file_);
    if (iVar4 <= iVar5) break;
    pvVar8 = std::
             vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
             ::operator[](&this->extension_generators_,(long)i_6);
    pEVar9 = std::
             unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
             ::operator->(pvVar8);
    (*pEVar9->_vptr_ExtensionGenerator[2])(pEVar9,local_18);
    i_6 = i_6 + 1;
  }
  local_248 = 0;
  local_24c = 0;
  while( true ) {
    iVar5 = local_24c;
    iVar4 = FileDescriptor::message_type_count(this->file_);
    pPVar2 = local_18;
    if (iVar4 <= iVar5) break;
    pvVar10 = std::
              vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
              ::operator[](&this->message_generators_,(long)local_24c);
    pMVar11 = std::
              unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
              ::operator->(pvVar10);
    (*pMVar11->_vptr_MessageGenerator[2])(pMVar11,local_18,&local_248);
    local_24c = local_24c + 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_260,"\n");
  io::Printer::Print<>(pPVar2,local_260);
  pFVar1 = this->file_;
  pCVar7 = std::
           unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
           ::operator->(&this->context_);
  bVar3 = Context::EnforceLite(pCVar7);
  bVar3 = HasDescriptorMethods(pFVar1,bVar3);
  pPVar2 = local_18;
  if (bVar3) {
    if ((this->immutable_api_ & 1U) != 0) {
      GenerateDescriptorInitializationCodeForImmutable(this,local_18);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&method_num,"static {\n");
    io::Printer::Print<>(pPVar2,_method_num);
    io::Printer::Indent(local_18);
    i_7 = 0;
    local_278 = 0;
    local_27c = 0;
    while( true ) {
      iVar5 = local_27c;
      iVar4 = FileDescriptor::message_type_count(this->file_);
      if (iVar4 <= iVar5) break;
      pvVar10 = std::
                vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                ::operator[](&this->message_generators_,(long)local_27c);
      pMVar11 = std::
                unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                ::operator->(pvVar10);
      iVar5 = (*pMVar11->_vptr_MessageGenerator[3])(pMVar11,local_18);
      i_7 = iVar5 + i_7;
      java::anon_unknown_0::MaybeRestartJavaMethod
                (local_18,&i_7,&local_278,"_clinit_autosplit_$method_num$();\n",
                 "private static void _clinit_autosplit_$method_num$() {\n");
      local_27c = local_27c + 1;
    }
    io::Printer::Outdent(local_18);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_290,"}\n");
    io::Printer::Print<>(pPVar2,local_290);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2a0,"\n// @@protoc_insertion_point(outer_class_scope)\n");
  io::Printer::Print<>(pPVar2,local_2a0);
  io::Printer::Outdent(local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b0,"}\n");
  io::Printer::Print<>(pPVar2,local_2b0);
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// NO CHECKED-IN PROTOBUF "
      // Intentional line breaker
      "GENCODE\n"
      "// source: $filename$\n",
      "filename", file_->name());
  if (options_.opensource_runtime) {
    printer->Print("// Protobuf Java Version: $protobuf_java_version$\n",
                   "protobuf_java_version", PROTOBUF_JAVA_VERSION_STRING);
  }
  printer->Print("\n");
  if (!java_package_.empty()) {
    printer->Print(
        "package $package$;\n"
        "\n",
        "package", java_package_);
  }
  PrintGeneratedAnnotation(
      printer, '$',
      options_.annotate_code ? absl::StrCat(classname_, ".java.pb.meta") : "",
      options_);

  if (!options_.opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }
  printer->Print(
      "$deprecation$public final class $classname$ {\n"
      "  private $ctor$() {}\n",
      "deprecation",
      file_->options().deprecated() ? "@java.lang.Deprecated " : "",
      "classname", classname_, "ctor", classname_);
  printer->Annotate("classname", file_->name());
  printer->Indent();

  if (!context_->EnforceLite()) {
    printer->Print("static {\n");
    printer->Indent();
    PrintGencodeVersionValidator(printer, options_.opensource_runtime,
                                 classname_);
    printer->Outdent();
    printer->Print("}\n");
  }

  // -----------------------------------------------------------------

  printer->Print(
      "public static void registerAllExtensions(\n"
      "    com.google.protobuf.ExtensionRegistryLite registry) {\n");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print("}\n");
  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    // Overload registerAllExtensions for the non-lite usage to
    // redundantly maintain the original signature (this is
    // redundant because ExtensionRegistryLite now invokes
    // ExtensionRegistry in the non-lite usage). Intent is
    // to remove this in the future.
    printer->Print(
        "\n"
        "public static void registerAllExtensions(\n"
        "    com.google.protobuf.ExtensionRegistry registry) {\n"
        "  registerAllExtensions(\n"
        "      (com.google.protobuf.ExtensionRegistryLite) registry);\n"
        "}\n");
  }

  // -----------------------------------------------------------------

  for (int i = 0; i < file_->enum_type_count(); i++) {
    if (NestedInFileClass(*file_->enum_type(i), immutable_api_)) {
      generator_factory_->NewEnumGenerator(file_->enum_type(i))
          ->Generate(printer);
    }
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    if (NestedInFileClass(*file_->message_type(i), immutable_api_)) {
      message_generators_[i]->GenerateInterface(printer);
      message_generators_[i]->Generate(printer);
    }
  }
  if (HasGenericServices(file_, context_->EnforceLite())) {
    for (int i = 0; i < file_->service_count(); i++) {
      if (NestedInFileClass(*file_->service(i), immutable_api_)) {
        std::unique_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        generator->Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->Generate(printer);
  }

  // Static variables. We'd like them to be final if possible, but due to
  // the JVM's 64k size limit on static blocks, we have to initialize some
  // of them in methods; thus they cannot be final.
  int static_block_bytecode_estimate = 0;
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariables(
        printer, &static_block_bytecode_estimate);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    if (immutable_api_) {
      GenerateDescriptorInitializationCodeForImmutable(printer);
    }
  } else {
    printer->Print("static {\n");
    printer->Indent();
    int bytecode_estimate = 0;
    int method_num = 0;

    for (int i = 0; i < file_->message_type_count(); i++) {
      bytecode_estimate +=
          message_generators_[i]->GenerateStaticVariableInitializers(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_$method_num$();\n",
          "private static void _clinit_autosplit_$method_num$() {\n");
    }

    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}